

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O1

void __thiscall QStatusBar::reformat(QStatusBar *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  Representation RVar6;
  QLayout *this_00;
  QLayout *layout;
  QSize QVar7;
  QSize QVar8;
  int extraout_var;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QMargins local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long **)(lVar1 + 0x288) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x288) + 0x20))();
  }
  lVar11 = *(long *)(lVar1 + 0x298);
  this_00 = (QLayout *)operator_new(0x20);
  if (lVar11 == 0) {
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00,&this->super_QWidget);
    *(QLayout **)(lVar1 + 0x288) = this_00;
    local_48.m_left.m_i = 0;
    local_48.m_top.m_i = 0;
    local_48.m_right.m_i = 0;
    local_48.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_48);
  }
  else {
    QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_00,&this->super_QWidget);
    *(QLayout **)(lVar1 + 0x288) = this_00;
    local_48.m_left.m_i = 0;
    local_48.m_top.m_i = 0;
    local_48.m_right.m_i = 0;
    local_48.m_bottom.m_i = 0;
    QLayout::setContentsMargins(this_00,&local_48);
    this_00 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00);
    QBoxLayout::addLayout(*(QBoxLayout **)(lVar1 + 0x288),this_00,0);
  }
  QBoxLayout::addSpacing((QBoxLayout *)this_00,3);
  layout = (QLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)layout);
  uVar12 = 0;
  QBoxLayout::addLayout((QBoxLayout *)this_00,layout,0);
  QBoxLayout::addSpacing((QBoxLayout *)layout,2);
  (**(code **)(*(long *)layout + 0x68))(layout,6);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_48,&((this->super_QWidget).data)->fnt);
  uVar5 = QFontMetrics::height();
  uVar9 = (ulong)uVar5;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_48);
  if (*(long *)(lVar1 + 0x268) != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      lVar2 = *(long *)(lVar1 + 0x260);
      iVar10 = *(int *)(lVar2 + 0xc + lVar11);
      if (iVar10 != 1) {
        QBoxLayout::addWidget
                  ((QBoxLayout *)layout,*(QWidget **)(lVar2 + lVar11),*(int *)(lVar2 + 8 + lVar11),
                   (Alignment)0x0);
        QVar7 = qSmartMinSize(*(QWidget **)(lVar2 + lVar11));
        QVar8 = QWidget::maximumSize(*(QWidget **)(lVar2 + lVar11));
        RVar6.m_i = QVar8.ht.m_i.m_i;
        if (QVar7.ht.m_i.m_i < QVar8.ht.m_i.m_i) {
          RVar6.m_i = QVar7.ht.m_i.m_i;
        }
        if (RVar6.m_i < (int)(uint)uVar9) {
          RVar6.m_i = (uint)uVar9;
        }
        uVar9 = (ulong)(uint)RVar6.m_i;
      }
      if (iVar10 == 1) break;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < *(ulong *)(lVar1 + 0x268));
  }
  iVar10 = (int)uVar9;
  QBoxLayout::addStretch((QBoxLayout *)layout,0);
  if (uVar12 < *(ulong *)(lVar1 + 0x268)) {
    lVar11 = uVar12 << 4;
    do {
      lVar2 = *(long *)(lVar1 + 0x260);
      QBoxLayout::addWidget
                ((QBoxLayout *)layout,*(QWidget **)(lVar2 + lVar11),*(int *)(lVar2 + 8 + lVar11),
                 (Alignment)0x0);
      QVar8 = qSmartMinSize(*(QWidget **)(lVar2 + lVar11));
      QVar7 = QWidget::maximumSize(*(QWidget **)(lVar2 + lVar11));
      if (QVar8.ht.m_i.m_i < QVar7.ht.m_i.m_i) {
        QVar7 = QVar8;
      }
      uVar3 = (ulong)QVar7 >> 0x20;
      if (QVar7.ht.m_i.m_i < (int)uVar9) {
        uVar3 = uVar9;
      }
      uVar9 = uVar3;
      iVar10 = (int)uVar9;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < *(ulong *)(lVar1 + 0x268));
  }
  if (*(long **)(lVar1 + 0x298) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x298) + 0x70))();
    iVar4 = extraout_var;
    if (extraout_var < iVar10) {
      iVar4 = iVar10;
    }
    iVar10 = iVar4;
    QBoxLayout::addSpacing(*(QBoxLayout **)(lVar1 + 0x288),1);
    QBoxLayout::addWidget
              (*(QBoxLayout **)(lVar1 + 0x288),*(QWidget **)(lVar1 + 0x298),0,(Alignment)0x40);
  }
  QBoxLayout::addStrut((QBoxLayout *)layout,iVar10);
  *(int *)(lVar1 + 0x2a4) = iVar10;
  QBoxLayout::addSpacing((QBoxLayout *)this_00,2);
  QLayout::activate(*(QLayout **)(lVar1 + 0x288));
  QWidget::update(&this->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStatusBar::reformat()
{
    Q_D(QStatusBar);
    if (d->box)
        delete d->box;

    QBoxLayout *vbox;
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        d->box = new QHBoxLayout(this);
        d->box->setContentsMargins(QMargins());
        vbox = new QVBoxLayout;
        d->box->addLayout(vbox);
    } else
#endif
    {
        vbox = d->box = new QVBoxLayout(this);
        d->box->setContentsMargins(QMargins());
    }
    vbox->addSpacing(3);
    QBoxLayout* l = new QHBoxLayout;
    vbox->addLayout(l);
    l->addSpacing(2);
    l->setSpacing(6);

    int maxH = fontMetrics().height();

    qsizetype i;
    for (i = 0; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        if (item.isPermanent())
            break;
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }

    l->addStretch(0);

    for (; i < d->items.size(); ++i) {
        const auto &item = d->items.at(i);
        l->addWidget(item.widget, item.stretch);
        int itemH = qMin(qSmartMinSize(item.widget).height(), item.widget->maximumHeight());
        maxH = qMax(maxH, itemH);
    }
#if QT_CONFIG(sizegrip)
    if (d->resizer) {
        maxH = qMax(maxH, d->resizer->sizeHint().height());
        d->box->addSpacing(1);
        d->box->addWidget(d->resizer, 0, Qt::AlignBottom);
    }
#endif
    l->addStrut(maxH);
    d->savedStrut = maxH;
    vbox->addSpacing(2);
    d->box->activate();
    update();
}